

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O1

void JPCommonLabel_fprint(JPCommonLabel *label,FILE *fp)

{
  _JPCommonLabelAccentPhrase *p_Var1;
  _JPCommonLabelWord *p_Var2;
  int iVar3;
  _JPCommonLabelWord *p_Var4;
  JPCommonLabelBreathGroup *pJVar5;
  _JPCommonLabelPhoneme *p_Var6;
  uint uVar7;
  
  pJVar5 = label->breath_head;
  if (pJVar5 != (JPCommonLabelBreathGroup *)0x0) {
    iVar3 = 0;
    uVar7 = 0;
    do {
      fprintf((FILE *)fp,"%d\n");
      for (p_Var1 = pJVar5->head; p_Var1 != (_JPCommonLabelAccentPhrase *)0x0; p_Var1 = p_Var1->next
          ) {
        fprintf((FILE *)fp,"   %d\n",(ulong)uVar7);
        for (p_Var2 = p_Var1->head; p_Var2 != (_JPCommonLabelWord *)0x0; p_Var2 = p_Var2->next) {
          fprintf((FILE *)fp,"      %s %s %s %s\n",p_Var2->pron,p_Var2->pos,p_Var2->ctype,
                  p_Var2->cform,iVar3);
          p_Var4 = p_Var2;
          do {
            p_Var4 = (_JPCommonLabelWord *)p_Var4->head;
            if (p_Var4 == (_JPCommonLabelWord *)0x0) break;
            fprintf((FILE *)fp,"         %s\n",p_Var4->pron);
            for (p_Var6 = (_JPCommonLabelPhoneme *)p_Var4->pos;
                (p_Var6 != (_JPCommonLabelPhoneme *)0x0 &&
                (fprintf((FILE *)fp,"            %s\n",p_Var6->phoneme),
                p_Var6 != (_JPCommonLabelPhoneme *)p_Var4->ctype)); p_Var6 = p_Var6->next) {
            }
          } while (p_Var4 != (_JPCommonLabelWord *)p_Var2->tail);
          if (p_Var2 == p_Var1->tail) break;
        }
        uVar7 = uVar7 + 1;
        if (p_Var1 == pJVar5->tail) break;
      }
      iVar3 = iVar3 + 1;
      pJVar5 = pJVar5->next;
    } while (pJVar5 != (_JPCommonLabelBreathGroup *)0x0);
  }
  return;
}

Assistant:

void JPCommonLabel_fprint(JPCommonLabel * label, FILE * fp)
{
   JPCommonLabelPhoneme *p;
   JPCommonLabelMora *m;
   JPCommonLabelWord *w;
   JPCommonLabelAccentPhrase *a;
   JPCommonLabelBreathGroup *b;
   int i = 0;
   int j = 0;

   for (b = label->breath_head; b != NULL; b = b->next) {
      fprintf(fp, "%d\n", j++);
      for (a = b->head; a != NULL; a = a->next) {
         fprintf(fp, "   %d\n", i++);
         for (w = a->head; w != NULL; w = w->next) {
            fprintf(fp, "      %s %s %s %s\n", w->pron, w->pos, w->ctype, w->cform);
            for (m = w->head; m != NULL; m = m->next) {
               fprintf(fp, "         %s\n", m->mora);
               for (p = m->head; p != NULL; p = p->next) {
                  fprintf(fp, "            %s\n", p->phoneme);
                  if (p == m->tail)
                     break;
               }
               if (m == w->tail)
                  break;
            }
            if (w == a->tail)
               break;
         }
         if (a == b->tail)
            break;
      }
   }
}